

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::PolygonNumSamplesCase::renderPattern(PolygonNumSamplesCase *this)

{
  int i_1;
  long lVar1;
  int i;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vec3 local_64;
  Vec3 local_58;
  Vec3 local_4c;
  Vec4 local_40;
  
  iVar2 = 0;
  do {
    fVar3 = (float)(this->super_NumSamplesCase).m_currentIteration * 0.001;
    fVar6 = ((float)iVar2 * 6.2831855) / 25.0 + fVar3;
    fVar3 = (((float)iVar2 + 0.5) * 6.2831855) / 25.0 + fVar3;
    fVar4 = cosf(fVar6);
    fVar6 = sinf(fVar6);
    fVar5 = cosf(fVar3);
    local_64.m_data[1] = sinf(fVar3);
    lVar1 = 0;
    do {
      local_40.m_data[lVar1] = 1.0;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    local_58.m_data[0] = fVar4 * 0.95;
    local_58.m_data[1] = fVar6 * 0.95;
    local_64.m_data[0] = fVar5 * 0.95;
    local_64.m_data[1] = local_64.m_data[1] * 0.95;
    local_4c.m_data[0] = 0.0;
    local_4c.m_data[1] = 0.0;
    local_4c.m_data[2] = 0.0;
    local_58.m_data[2] = 0.0;
    local_64.m_data[2] = 0.0;
    MultisampleCase::renderTriangle
              ((MultisampleCase *)this,&local_4c,&local_58,&local_64,&local_40,&local_40,&local_40);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x19);
  return;
}

Assistant:

void PolygonNumSamplesCase::renderPattern (void) const
{
	// The test pattern consists of several triangles with edges at different angles.

	const int numTriangles = 25;
	for (int i = 0; i < numTriangles; i++)
	{
		float angle0 = 2.0f*DE_PI * (float)i			/ (float)numTriangles + 0.001f*(float)m_currentIteration;
		float angle1 = 2.0f*DE_PI * ((float)i + 0.5f)	/ (float)numTriangles + 0.001f*(float)m_currentIteration;

		renderTriangle(Vec2(0.0f, 0.0f),
					   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
					   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
					   Vec4(1.0f));
	}
}